

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O3

void __thiscall sf::priv::GlxContext::GlxContext(GlxContext *this,GlxContext *shared)

{
  Display *display;
  VideoMode VVar1;
  
  GlContext::GlContext(&this->super_GlContext);
  (this->super_GlContext)._vptr_GlContext = (_func_int **)&PTR__GlxContext_001d2bd0;
  this->m_display = (Display *)0x0;
  this->m_window = 0;
  this->m_context = (GLXContext)0x0;
  this->m_pbuffer = 0;
  this->m_ownsWindow = false;
  (this->super_GlContext).m_settings.depthBits = 0;
  (this->super_GlContext).m_settings.stencilBits = 0;
  (this->super_GlContext).m_settings.antialiasingLevel = 0;
  (this->super_GlContext).m_settings.majorVersion = 1;
  (this->super_GlContext).m_settings.minorVersion = 1;
  (this->super_GlContext).m_settings.attributeFlags = 0;
  (this->super_GlContext).m_settings.sRgbCapable = false;
  display = OpenDisplay();
  this->m_display = display;
  anon_unknown.dwarf_2798a6::ensureExtensionsInit(display,*(int *)(display + 0xe0));
  VVar1 = VideoMode::getDesktopMode();
  createSurface(this,shared,1,1,VVar1.bitsPerPixel);
  createContext(this,shared);
  return;
}

Assistant:

GlxContext::GlxContext(GlxContext* shared) :
m_display   (NULL),
m_window    (0),
m_context   (NULL),
m_pbuffer   (0),
m_ownsWindow(false)
{
    // Save the creation settings
    m_settings = ContextSettings();

    // Open the connection with the X server
    m_display = OpenDisplay();

    // Make sure that extensions are initialized
    ensureExtensionsInit(m_display, DefaultScreen(m_display));

    // Create the rendering surface (window or pbuffer if supported)
    createSurface(shared, 1, 1, VideoMode::getDesktopMode().bitsPerPixel);

    // Create the context
    createContext(shared);
}